

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O3

iterator __thiscall
duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>_>::operator()
          (printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>_> *this,char *value)

{
  format_specs *pfVar1;
  size_t in_RCX;
  void *in_RDX;
  int __fd;
  
  if (value == (char *)0x0) {
    pfVar1 = (this->
             super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
             ).specs_;
    if (pfVar1->type == 'p') {
      pfVar1->type = '\0';
      __fd = 0x1dbf4f1;
    }
    else {
      __fd = 0x1dbf4ea;
    }
    internal::
    arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    ::write(&this->
             super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
            ,__fd,in_RDX,in_RCX);
  }
  else {
    internal::
    arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    ::operator()(&this->
                  super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
                 ,value);
  }
  return (iterator)
         (this->
         super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
         ).writer_.out_.container;
}

Assistant:

iterator operator()(const char* value) {
    if (value)
      base::operator()(value);
    else if (this->specs()->type == 'p')
      write_null_pointer(char_type());
    else
      this->write("(null)");
    return this->out();
  }